

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_test.cpp
# Opt level: O2

void __thiscall bit_test_main_Test::~bit_test_main_Test(bit_test_main_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(bit_test, main) {
  // test bit_count
  static_assert(bit_count(0b1) == 1, "[-][bit_test] bit_count failed");
  static_assert(bit_count(0b0) == 0, "[-][bit_test] bit_count failed");
  static_assert(bit_count(0b11111111) == 8, "[-][bit_test] bit_count failed");
  static_assert(
      bit_count(
          0b1000000000000000000000000000000000000000000000000000000000000001) ==
          2,
      "[-][bit_test] bit_count failed");
  static_assert(bit_count(33685634) == 4, "[-][bit_test] bit_count failed");

  // test bit_mask
  static_assert(bit_mask<unsigned>(0, 1, 2, 3) == 0b1111,
                "[-][bit_test] bit_mask failed");
  static_assert(bit_mask<unsigned>(0, 2, 4) == 0b10101,
                "[-][bit_test] bit_mask failed");

  // runtime tests
  EXPECT_EQ(bit_count(0b0), 0);
  EXPECT_EQ(bit_count(0b1), 1);
  EXPECT_EQ(bit_count(0b11111111), 8);

  EXPECT_EQ(stringify(0b0u), "0b00000000000000000000000000000000");
  EXPECT_EQ(stringify(0b10u), "0b00000000000000000000000000000010");
  EXPECT_EQ(stringify(0b1011u), "0b00000000000000000000000000001011");
}